

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.cpp
# Opt level: O1

int __thiscall
x86Instruction::Decode(x86Instruction *this,CodeGenRegVmStateContext *ctx,char *buf,uint bufSize)

{
  x86Argument *this_00;
  x86Command xVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  bool useMmWord;
  
  pcVar7 = buf;
  if (ctx->vsAsmStyle == true) {
    pcVar7 = buf + 1;
    *buf = ' ';
  }
  xVar1 = this->name;
  if ((ulong)xVar1 == 0x49) {
    builtin_strncpy(pcVar7,"  ; ",5);
    sVar3 = strlen(pcVar7);
    pcVar7 = pcVar7 + sVar3;
    strcpy(pcVar7,(this->field_4).comment);
    sVar3 = strlen(pcVar7);
    pcVar8 = pcVar7 + sVar3;
  }
  else if (xVar1 == o_label) {
    iVar2 = NULLC::SafeSprintf(pcVar7,(ulong)(((int)buf - (int)pcVar7) + bufSize),"0x%p:",
                               (ulong)(this->field_4).labelID);
    pcVar8 = pcVar7 + iVar2;
  }
  else {
    strcpy(pcVar7,*(char **)((anonymous_namespace)::x86CmdText + (ulong)xVar1 * 8));
    sVar3 = strlen(pcVar7);
    pcVar8 = pcVar7 + sVar3;
    if (ctx->vsAsmStyle == true) {
      sVar4 = strlen(*(char **)((anonymous_namespace)::x86CmdText + (ulong)this->name * 8));
      if ((uint)sVar4 < 0xb) {
        uVar6 = (ulong)(10 - (uint)sVar4);
        memset(pcVar8,0x20,uVar6 + 1);
        pcVar8 = pcVar7 + sVar3 + uVar6 + 1;
      }
    }
  }
  if (this->name != o_none) {
    this_00 = &this->argA;
    if ((this->argA).type != argNone) {
      *pcVar8 = ' ';
      xVar1 = this->name;
      bVar5 = true;
      if ((((1 < xVar1 - o_push) && (xVar1 != o_call)) && ((int)xVar1 < 0x4d)) &&
         ((xVar1 != o_movsxd && ((this->argA).type != argPtr)))) {
        bVar5 = xVar1 != o_cvttsd2si &&
                ((this->argB).field_1.reg == rEDX && (this->argB).type == argPtr);
      }
      iVar2 = x86Argument::Decode(this_00,ctx,pcVar8 + 1,bufSize,bVar5,
                                  (bool)((this->argB).type == argXmmReg & ctx->vsAsmStyle),
                                  xVar1 == o_lea);
      pcVar8 = pcVar8 + 1 + iVar2;
    }
    if ((this->argB).type != argNone) {
      *pcVar8 = ',';
      if (ctx->vsAsmStyle == false) {
        pcVar8[1] = ' ';
        pcVar8 = pcVar8 + 2;
      }
      else {
        pcVar8 = pcVar8 + 1;
      }
      xVar1 = this->name;
      bVar5 = true;
      if (((xVar1 != o_movsxd) && ((int)xVar1 < 0x4d)) && ((this->argB).type != argPtr)) {
        if (this_00->type == argPtr) {
          bVar5 = (this->argA).field_1.reg == rEDX;
        }
        else {
          bVar5 = false;
        }
      }
      if (ctx->vsAsmStyle == true) {
        useMmWord = true;
        if (this_00->type != argXmmReg) {
          useMmWord = (xVar1 - o_cvttsd2si & 0xffffffdf) == 0;
        }
      }
      else {
        useMmWord = false;
      }
      iVar2 = x86Argument::Decode(&this->argB,ctx,pcVar8,bufSize,bVar5,useMmWord,xVar1 == o_lea);
      pcVar8 = pcVar8 + iVar2;
    }
  }
  if (ctx->vsAsmStyle == true) {
    pcVar8[0] = ' ';
    pcVar8[1] = ' ';
    pcVar8[2] = '\0';
    pcVar8 = pcVar8 + 2;
  }
  if (pcVar8 < buf + bufSize) {
    __assert_fail("buf + bufSize <= curr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Instruction_X86.cpp"
                  ,0x115,
                  "int x86Instruction::Decode(CodeGenRegVmStateContext &, char *, unsigned int)");
  }
  return (int)pcVar8 - (int)buf;
}

Assistant:

int	x86Instruction::Decode(CodeGenRegVmStateContext &ctx, char *buf, unsigned bufSize)
{
	char *curr = buf;

	if(ctx.vsAsmStyle)
		*curr++ = ' ';

	if(name == o_label)
	{
		curr += NULLC::SafeSprintf(curr, bufSize - unsigned(curr - buf), "0x%p:", (void*)(intptr_t)labelID);
	}
	else if(name == o_other)
	{
		strcpy(curr, "  ; ");
		curr += strlen(curr);

		strcpy(curr, comment);
		curr += strlen(curr);
	}
	else
	{
		strcpy(curr, x86CmdText[name]);
		curr += strlen(curr);

		if(ctx.vsAsmStyle)
		{
			for(unsigned width = (unsigned)strlen(x86CmdText[name]); width < 11; width++)
				*curr++ = ' ';
		}
	}

	if(name != o_none)
	{
		if(argA.type != x86Argument::argNone)
		{
			*curr++ = ' ';

			bool usex64 = name >= o_mov64 || name == o_movsxd || ((argA.type == x86Argument::argPtr || name == o_call || name == o_push || name == o_pop) && sizeof(void*) == 8) || (argB.type == x86Argument::argPtr && argB.ptrSize == sQWORD && name != o_cvttsd2si);
			bool useMmWord = ctx.vsAsmStyle && argB.type == x86Argument::argXmmReg;

			curr += argA.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
		if(argB.type != x86Argument::argNone)
		{
			*curr++ = ',';

			if(!ctx.vsAsmStyle)
				*curr++ = ' ';

			bool usex64 = name >= o_mov64 || (argB.type == x86Argument::argPtr && sizeof(void*) == 8) || name == o_movsxd || (argA.type == x86Argument::argPtr && argA.ptrSize == sQWORD);
			bool useMmWord = ctx.vsAsmStyle && (argA.type == x86Argument::argXmmReg || name == o_cvttsd2si || name == o_cvttsd2si64);

			curr += argB.Decode(ctx, curr, bufSize, usex64, useMmWord, name == o_lea);
		}
	}

	if(ctx.vsAsmStyle)
	{
		*curr++ = ' ';
		*curr++ = ' ';
		*curr = 0;
	}

	assert(buf + bufSize <= curr);
	return int(curr - buf);
}